

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O2

Vec_Int_t * Gia_ManFindPivots(Gia_Man_t *p,int SelectShift,int fOnlyCis,int fVerbose)

{
  uint nSize;
  ulong uVar1;
  int Entry;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar7;
  int *piVar8;
  ulong uVar9;
  int *pArray;
  int i;
  ulong uVar10;
  bool bVar11;
  
  Gia_ManCreateRefs(p);
  piVar8 = p->pRefs;
  iVar5 = p->nObjs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nSize = iVar5;
  pVVar6->nCap = iVar5;
  pVVar6->pArray = piVar8;
  p->pRefs = (int *)0x0;
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  i = 0;
  if (iVar5 < 1) {
    iVar5 = i;
  }
  for (; iVar5 != i; i = i + 1) {
    Entry = Vec_IntEntry(pVVar6,i);
    if ((1 < Entry) &&
       ((fOnlyCis == 0 || (pGVar7 = Gia_ManObj(p,i), (~*(uint *)pGVar7 & 0x9fffffff) == 0)))) {
      Vec_IntPush(p_00,i);
      Vec_IntPush(p_01,Entry);
    }
  }
  Vec_IntFree(pVVar6);
  if (fVerbose != 0) {
    iVar5 = p->vCis->nSize;
    printf("Selected %d pivots with more than one fanout (out of %d CIs and ANDs).\n",
           (ulong)(uint)p_01->nSize,(ulong)(uint)(iVar5 + p->nObjs + ~(p->vCos->nSize + iVar5)));
  }
  Gia_ManRandom(1);
  uVar10 = 0;
  Gia_ManRandom(0);
  nSize = p_01->nSize;
  uVar9 = 0;
  if (0 < (int)nSize) {
    uVar9 = (ulong)nSize;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    uVar2 = Gia_ManRandom(0);
    uVar1 = (ulong)(uVar2 >> 1) % (ulong)nSize;
    piVar8 = p_00->pArray;
    iVar5 = piVar8[uVar10];
    piVar8[uVar10] = piVar8[uVar1];
    piVar8[uVar1] = iVar5;
    piVar8 = p_01->pArray;
    iVar5 = piVar8[uVar10];
    piVar8[uVar10] = piVar8[uVar1];
    piVar8[uVar1] = iVar5;
  }
  if (SelectShift == 0) {
    piVar8 = Abc_QuickSortCost(p_01->pArray,nSize,1);
  }
  else {
    pVVar6 = Vec_IntAlloc(nSize);
    piVar8 = pVVar6->pArray;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      piVar8[uVar10] = (int)uVar10;
    }
    pVVar6->nCap = 0;
    pVVar6->nSize = 0;
    pVVar6->pArray = (int *)0x0;
    Vec_IntFree(pVVar6);
  }
  uVar2 = 0x40;
  if ((int)nSize < 0x40) {
    uVar2 = nSize;
  }
  pVVar6 = Vec_IntAlloc(uVar2);
  if ((int)uVar2 < 1) {
    uVar2 = 0;
  }
  while (bVar11 = uVar2 != 0, uVar2 = uVar2 - 1, bVar11) {
    iVar5 = (int)((long)SelectShift % (long)(int)nSize);
    if (fVerbose != 0) {
      uVar3 = Vec_IntEntry(p_00,piVar8[iVar5]);
      uVar4 = Vec_IntEntry(p_01,piVar8[iVar5]);
      printf("%2d : Pivot =%7d  Fanout =%7d\n",(long)SelectShift % (long)(int)nSize & 0xffffffff,
             (ulong)uVar3,(ulong)uVar4);
    }
    iVar5 = Vec_IntEntry(p_00,piVar8[iVar5]);
    Vec_IntPush(pVVar6,iVar5);
    SelectShift = SelectShift + 1;
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  free(piVar8);
  return pVVar6;
}

Assistant:

Vec_Int_t * Gia_ManFindPivots( Gia_Man_t * p, int SelectShift, int fOnlyCis, int fVerbose )
{
    Vec_Int_t * vPivots, * vWeights;
    Vec_Int_t * vCount, * vResult;
    int i, j, Count, * pPerm, Limit;
/*
    Gia_Obj_t * pObj;
    // count MUX controls
    vCount = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        Gia_Obj_t * pNodeC, * pNodeT, * pNodeE;
        if ( !Gia_ObjIsMuxType(pObj) ) 
            continue;
        pNodeC = Gia_ObjRecognizeMux( pObj, &pNodeT, &pNodeE );
        Vec_IntAddToEntry( vCount, Gia_ObjId(p, Gia_Regular(pNodeC)), 1 );
    }
*/
    // count references
    Gia_ManCreateRefs( p );
    vCount = Vec_IntAllocArray( p->pRefs, Gia_ManObjNum(p) ); p->pRefs = NULL;

    // collect nodes 
    vPivots  = Vec_IntAlloc( 100 );
    vWeights = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vCount, Count, i )
    {
        if ( Count < 2 ) continue;
        if ( fOnlyCis && !Gia_ObjIsCi(Gia_ManObj(p, i)) )
            continue;
        Vec_IntPush( vPivots, i );
        Vec_IntPush( vWeights, Count );
    }
    Vec_IntFree( vCount );

    if ( fVerbose )
        printf( "Selected %d pivots with more than one fanout (out of %d CIs and ANDs).\n", Vec_IntSize(vWeights), Gia_ManCiNum(p) + Gia_ManAndNum(p) );

    // permute
    Gia_ManRandom(1);
    Gia_ManRandom(0);
    for ( i = 0; i < Vec_IntSize(vWeights); i++ )
    {
        j = (Gia_ManRandom(0) >> 1) % Vec_IntSize(vWeights);
        ABC_SWAP( int, vPivots->pArray[i], vPivots->pArray[j] );
        ABC_SWAP( int, vWeights->pArray[i], vWeights->pArray[j] );
    }
    // sort
    if ( SelectShift == 0 )
        pPerm = Abc_QuickSortCost( Vec_IntArray(vWeights), Vec_IntSize(vWeights), 1 );
    else
    {
        Vec_Int_t * vTemp = Vec_IntStartNatural( Vec_IntSize(vWeights) );
        pPerm = Vec_IntReleaseArray( vTemp );
        Vec_IntFree( vTemp );
    }

    // select    
    Limit = Abc_MinInt( 64, Vec_IntSize(vWeights) );
    vResult = Vec_IntAlloc( Limit );
    for ( i = 0; i < Limit; i++ )
    {
        j = (i + SelectShift) % Vec_IntSize(vWeights);
        if ( fVerbose )
            printf( "%2d : Pivot =%7d  Fanout =%7d\n", j, Vec_IntEntry(vPivots, pPerm[j]), Vec_IntEntry(vWeights, pPerm[j]) );
        Vec_IntPush( vResult, Vec_IntEntry(vPivots, pPerm[j]) );
    }

    Vec_IntFree( vPivots );
    Vec_IntFree( vWeights );
    ABC_FREE( pPerm );

    return vResult;
}